

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O1

void test_master_table_dictionary_create_delete
               (planck_unit_test_t *tc,Dictionary<int,_int> *dictionary,
               ion_dictionary_size_t dictionary_size,ion_dictionary_type_t dictionary_type)

{
  ion_dictionary_id_t id;
  ion_err_t iVar1;
  MasterTable *master_table;
  Dictionary<int,_int> *master_table_00;
  MasterTable *master_table_01;
  
  master_table_00 = dictionary;
  master_table = (MasterTable *)operator_new(0x50);
  ion_init_master_table();
  master_table_close(tc,(MasterTable *)master_table_00);
  remove("ion_mt.tbl");
  master_table_init(tc,(MasterTable *)master_table_00);
  master_table_01 = master_table;
  master_table_dictionary_add
            (tc,master_table,dictionary,key_type_numeric_signed,4,4,dictionary_size,dictionary_type)
  ;
  id = ((dictionary->dict).instance)->id;
  if (dictionary != (Dictionary<int,_int> *)0x0) {
    iVar1 = dictionary_delete_dictionary(&dictionary->dict);
    (dictionary->last_status).error = iVar1;
    operator_delete(dictionary);
  }
  master_table_delete_from_master_table(tc,master_table_01,id);
  ion_delete_master_table();
  operator_delete(master_table);
  return;
}

Assistant:

void
test_master_table_dictionary_create_delete(
	planck_unit_test_t *tc,
	Dictionary<int, int>	*dictionary,
	ion_dictionary_size_t dictionary_size,
	ion_dictionary_type_t dictionary_type
) {
	MasterTable *master_table = new MasterTable();

	master_table_setup(tc, master_table);
	master_table_init(tc, master_table);
	master_table_dictionary_add(tc, master_table, dictionary, key_type_numeric_signed, sizeof(int), sizeof(int), dictionary_size, dictionary_type);

	ion_dictionary_id_t id = dictionary->dict.instance->id;

	delete dictionary;

	master_table_delete_from_master_table(tc, master_table, id);

	delete master_table;
}